

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsCurveShapeFunction.h
# Opt level: O0

void __thiscall
anurbs::NurbsCurveShapeFunction::compute_at_span
          (NurbsCurveShapeFunction *this,
          Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *knots,
          Index span,double t)

{
  double dVar1;
  double dVar2;
  double dVar3;
  Index IVar4;
  double *pdVar5;
  Scalar *pSVar6;
  VectorXd *this_00;
  long j_00;
  long j_01;
  double *pdVar7;
  VectorXd *this_01;
  CoeffReturnType CVar8;
  double *local_170;
  long local_168;
  long local_b8;
  Index j_3;
  Index k_1;
  Index s;
  Index j_2;
  Index j2;
  Index j1;
  Index pk;
  Index rk;
  double *v;
  Index k;
  Index r_1;
  VectorXd *b;
  VectorXd *a;
  Index j_1;
  double temp;
  Index r;
  double saved;
  Index j;
  double t_local;
  Index span_local;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *knots_local;
  NurbsCurveShapeFunction *this_local;
  
  clear_values(this);
  IVar4 = degree(this);
  this->m_first_nonzero_pole = (span - IVar4) + 1;
  pdVar5 = ndu(this,0,0);
  *pdVar5 = 1.0;
  saved = 0.0;
  while( true ) {
    IVar4 = degree(this);
    if (IVar4 <= (long)saved) break;
    CVar8 = Eigen::
            DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
            ::operator[]((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                          *)knots,span - (long)saved);
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&this->m_left,
                        (Index)saved);
    *pSVar6 = t - CVar8;
    CVar8 = Eigen::
            DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
            ::operator[]((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                          *)knots,span + (long)saved + 1);
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&this->m_right
                        ,(Index)saved);
    *pSVar6 = CVar8 - t;
    r = 0;
    for (temp = 0.0; (long)temp <= (long)saved; temp = (double)((long)temp + 1)) {
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          &this->m_right,(Index)temp);
      dVar1 = *pSVar6;
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          &this->m_left,(long)saved - (long)temp);
      dVar2 = *pSVar6;
      pdVar5 = ndu(this,(long)saved + 1,(Index)temp);
      *pdVar5 = dVar1 + dVar2;
      pdVar5 = ndu(this,(Index)temp,(Index)saved);
      dVar1 = *pdVar5;
      pdVar5 = ndu(this,(long)saved + 1,(Index)temp);
      dVar2 = *pdVar5;
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          &this->m_right,(Index)temp);
      dVar3 = *pSVar6;
      pdVar5 = ndu(this,(Index)temp,(long)saved + 1);
      *pdVar5 = dVar3 * (dVar1 / dVar2) + (double)r;
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          &this->m_left,(long)saved - (long)temp);
      r = (Index)(*pSVar6 * (dVar1 / dVar2));
    }
    pdVar5 = ndu(this,(long)saved + 1,(long)saved + 1);
    *pdVar5 = (double)r;
    saved = (double)((long)saved + 1);
  }
  a = (VectorXd *)0x0;
  while( true ) {
    IVar4 = nb_nonzero_poles(this);
    if (IVar4 <= (long)a) break;
    IVar4 = degree(this);
    pdVar5 = ndu(this,(Index)a,IVar4);
    dVar1 = *pdVar5;
    pdVar5 = value(this,0,(Index)a);
    *pdVar5 = dVar1;
    a = (VectorXd *)
        ((long)&(a->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
        + 1);
  }
  this_01 = &this->m_a;
  this_00 = &this->m_b;
  k = 0;
  while( true ) {
    IVar4 = nb_nonzero_poles(this);
    if (IVar4 <= k) break;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_01,0);
    *pSVar6 = 1.0;
    v = (double *)0x1;
    while( true ) {
      IVar4 = nb_shapes(this);
      if (IVar4 <= (long)v) break;
      pdVar5 = value(this,(Index)v,k);
      j_00 = k - (long)v;
      IVar4 = degree(this);
      j_01 = IVar4 - (long)v;
      if ((long)v <= k) {
        pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_01,0)
        ;
        dVar1 = *pSVar6;
        pdVar7 = ndu(this,j_01 + 1,j_00);
        dVar2 = *pdVar7;
        pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,0)
        ;
        *pSVar6 = dVar1 / dVar2;
        pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,0)
        ;
        dVar1 = *pSVar6;
        pdVar7 = ndu(this,j_00,j_01);
        *pdVar5 = dVar1 * *pdVar7;
      }
      if (k < (long)v + -1) {
        local_168 = (long)v - k;
      }
      else {
        local_168 = 1;
      }
      if (j_01 + 1 < k) {
        IVar4 = nb_nonzero_poles(this);
        local_170 = (double *)(IVar4 - k);
      }
      else {
        local_170 = v;
      }
      for (s = local_168; s < (long)local_170; s = s + 1) {
        pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_01,s)
        ;
        dVar1 = *pSVar6;
        pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_01,
                            s + -1);
        dVar2 = *pSVar6;
        pdVar7 = ndu(this,j_01 + 1,j_00 + s);
        dVar3 = *pdVar7;
        pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,s)
        ;
        *pSVar6 = (dVar1 - dVar2) / dVar3;
        pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,s)
        ;
        dVar1 = *pSVar6;
        pdVar7 = ndu(this,j_00 + s,j_01);
        *pdVar5 = dVar1 * *pdVar7 + *pdVar5;
      }
      if (k <= j_01) {
        pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_01,
                            (long)v + -1);
        dVar1 = *pSVar6;
        pdVar7 = ndu(this,j_01 + 1,k);
        dVar2 = *pdVar7;
        pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,
                            (Index)v);
        *pSVar6 = -dVar1 / dVar2;
        pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,
                            (Index)v);
        dVar1 = *pSVar6;
        pdVar7 = ndu(this,k,j_01);
        *pdVar5 = dVar1 * *pdVar7 + *pdVar5;
      }
      std::swap<Eigen::Matrix<double,_1,1,0,_1,1>>(this_01,this_00);
      v = (double *)((long)v + 1);
    }
    k = k + 1;
  }
  k_1 = degree(this);
  j_3 = 1;
  while( true ) {
    IVar4 = nb_shapes(this);
    if (IVar4 <= j_3) break;
    local_b8 = 0;
    while( true ) {
      IVar4 = nb_nonzero_poles(this);
      if (IVar4 <= local_b8) break;
      pdVar5 = value(this,j_3,local_b8);
      *pdVar5 = (double)k_1 * *pdVar5;
      local_b8 = local_b8 + 1;
    }
    IVar4 = degree(this);
    k_1 = (IVar4 - j_3) * k_1;
    j_3 = j_3 + 1;
  }
  return;
}

Assistant:

void compute_at_span(Eigen::Ref<const Eigen::VectorXd> knots, const Index span, const double t)
    {
        clear_values();

        m_first_nonzero_pole = span - degree() + 1;

        // compute B-Spline shape

        ndu(0, 0) = 1.0;

        for (Index j = 0; j < degree(); j++) {
            m_left[j] = t - knots[span - j];
            m_right[j] = knots[span + j + 1] - t;

            double saved = 0.0;

            for (Index r = 0; r <= j; r++) {
                ndu(j + 1, r) = m_right[r] + m_left[j - r];

                double temp = ndu(r, j) / ndu(j + 1, r);

                ndu(r, j + 1) = saved + m_right[r] * temp;

                saved = m_left[j - r] * temp;
            }

            ndu(j + 1, j + 1) = saved;
        }

        for (Index j = 0; j < nb_nonzero_poles(); j++) {
            value(0, j) = ndu(j, degree());
        }

        auto& a = m_a;
        auto& b = m_b;

        for (Index r = 0; r < nb_nonzero_poles(); r++) {
            a[0] = 1.0;

            for (Index k = 1; k < nb_shapes(); k++) {
                double& v = value(k, r);

                Index rk = r - k;
                Index pk = degree() - k;

                if (r >= k) {
                    b[0] = a[0] / ndu(pk + 1, rk);
                    v = b[0] * ndu(rk, pk);
                }

                Index j1 = r >= k - 1 ? 1 : k - r;
                Index j2 = r <= pk + 1 ? k : nb_nonzero_poles() - r;

                for (Index j = j1; j < j2; j++) {
                    b[j] = (a[j] - a[j - 1]) / ndu(pk + 1, rk + j);
                    v += b[j] * ndu(rk + j, pk);
                }

                if (r <= pk) {
                    b[k] = -a[k - 1] / ndu(pk + 1, r);
                    v += b[k] * ndu(r, pk);
                }

                std::swap(a, b);
            }
        }

        Index s = degree();

        for (Index k = 1; k < nb_shapes(); k++) {
            for (Index j = 0; j < nb_nonzero_poles(); j++) {
                value(k, j) *= s;
            }
            s *= degree() - k;
        }
    }